

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O2

void __thiscall
ON_PolylineCurve::SetArcLengthParameterization(ON_PolylineCurve *this,double tolerance)

{
  int iVar1;
  ON_3dPoint *pOVar2;
  double *pdVar3;
  int i;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  ON_3dVector local_40;
  
  *(this->m_t).m_a = 0.0;
  iVar1 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_count;
  lVar5 = 0x18;
  for (lVar4 = 1; lVar4 < iVar1; lVar4 = lVar4 + 1) {
    pOVar2 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a;
    ON_3dPoint::operator-
              (&local_40,(ON_3dPoint *)((long)&pOVar2->x + lVar5),
               (ON_3dPoint *)((long)&pOVar2[-1].x + lVar5));
    dVar6 = ON_3dVector::Length(&local_40);
    dVar7 = tolerance;
    if (tolerance <= dVar6) {
      dVar7 = dVar6;
    }
    pdVar3 = (this->m_t).m_a;
    dVar6 = pdVar3[lVar4 + -1];
    dVar8 = ABS(dVar6) * 1e-05;
    if (dVar8 <= dVar7) {
      dVar8 = dVar7;
    }
    pdVar3[lVar4] = dVar8 + dVar6;
    lVar5 = lVar5 + 0x18;
  }
  return;
}

Assistant:

void ON_PolylineCurve::SetArcLengthParameterization(double tolerance)
{
  double d, mind = tolerance;
  m_t[0] = 0;
  const int count = m_pline.Count();
  for (int i = 1; i < count; i++)
  {
    d = (m_pline[i] - m_pline[i - 1]).Length();
    if (d < mind)
      d = mind;
    if (d < fabs(m_t[i - 1]) * 1e-5)
      d = fabs(m_t[i - 1]) * 1e-5;
    m_t[i] = m_t[i - 1] + d;
  }
}